

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O2

void __thiscall SQClass::Finalize(SQClass *this)

{
  SQUnsignedInteger *pSVar1;
  SQTable *pSVar2;
  SQClass *pSVar3;
  long lVar4;
  SQInteger _n_;
  long lVar5;
  SQClassMember local_38;
  
  SQObjectPtr::Null(&this->_attributes);
  lVar4 = 0;
  for (lVar5 = 0; lVar5 < (long)(this->_defaultvalues)._size; lVar5 = lVar5 + 1) {
    SQClassMember::Null((SQClassMember *)
                        ((long)&(((this->_defaultvalues)._vals)->val).super_SQObject._type + lVar4))
    ;
    lVar4 = lVar4 + 0x20;
  }
  local_38.val.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_38.attrs.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_38.val.super_SQObject._type = OT_NULL;
  local_38.val.super_SQObject._4_4_ = 0;
  local_38.attrs.super_SQObject._type = OT_NULL;
  local_38.attrs.super_SQObject._4_4_ = 0;
  sqvector<SQClassMember>::resize(&this->_methods,0,&local_38);
  SQClassMember::~SQClassMember(&local_38);
  for (lVar4 = 0x70; lVar4 != 400; lVar4 = lVar4 + 0x10) {
    SQObjectPtr::Null((SQObjectPtr *)
                      ((long)&(((SQClass *)(this->_metamethods + -7))->super_SQCollectable).
                              super_SQRefCounted._vptr_SQRefCounted + lVar4));
  }
  pSVar2 = this->_members;
  if (pSVar2 != (SQTable *)0x0) {
    pSVar1 = &(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar2->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
    }
    this->_members = (SQTable *)0x0;
  }
  pSVar3 = this->_base;
  if (pSVar3 != (SQClass *)0x0) {
    pSVar1 = &(pSVar3->super_SQCollectable).super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar3->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
    }
    this->_base = (SQClass *)0x0;
  }
  return;
}

Assistant:

void SQClass::Finalize() {
    _attributes.Null();
    _NULL_SQOBJECT_VECTOR(_defaultvalues,_defaultvalues.size());
    _methods.resize(0);
    _NULL_SQOBJECT_VECTOR(_metamethods,MT_LAST);
    __ObjRelease(_members);
    if(_base) {
        __ObjRelease(_base);
    }
}